

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int saveCursorKey(BtCursor *pCur)

{
  u32 uVar1;
  i64 iVar2;
  void *pvVar3;
  long in_RDI;
  void *pKey;
  int rc;
  undefined4 in_stack_fffffffffffffff0;
  int iVar4;
  
  iVar4 = 0;
  if (*(char *)(in_RDI + 0x55) == '\0') {
    uVar1 = sqlite3BtreePayloadSize((BtCursor *)0x16c8df);
    *(ulong *)(in_RDI + 0x48) = (ulong)uVar1;
    pvVar3 = sqlite3Malloc(CONCAT44(iVar4,in_stack_fffffffffffffff0));
    if (pvVar3 == (void *)0x0) {
      iVar4 = 7;
    }
    else {
      iVar4 = sqlite3BtreePayload((BtCursor *)CONCAT44(iVar4,in_stack_fffffffffffffff0),
                                  (u32)((ulong)pvVar3 >> 0x20),(u32)pvVar3,(void *)0x16c928);
      if (iVar4 == 0) {
        memset((void *)((long)pvVar3 + *(long *)(in_RDI + 0x48)),0,0x11);
        *(void **)(in_RDI + 0x18) = pvVar3;
      }
      else {
        sqlite3_free((void *)0x16c964);
      }
    }
  }
  else {
    iVar2 = sqlite3BtreeIntegerKey((BtCursor *)0x16c8b6);
    *(i64 *)(in_RDI + 0x48) = iVar2;
  }
  return iVar4;
}

Assistant:

static int saveCursorKey(BtCursor *pCur){
  int rc = SQLITE_OK;
  assert( CURSOR_VALID==pCur->eState );
  assert( 0==pCur->pKey );
  assert( cursorHoldsMutex(pCur) );

  if( pCur->curIntKey ){
    /* Only the rowid is required for a table btree */
    pCur->nKey = sqlite3BtreeIntegerKey(pCur);
  }else{
    /* For an index btree, save the complete key content. It is possible
    ** that the current key is corrupt. In that case, it is possible that
    ** the sqlite3VdbeRecordUnpack() function may overread the buffer by
    ** up to the size of 1 varint plus 1 8-byte value when the cursor
    ** position is restored. Hence the 17 bytes of padding allocated
    ** below. */
    void *pKey;
    pCur->nKey = sqlite3BtreePayloadSize(pCur);
    pKey = sqlite3Malloc( pCur->nKey + 9 + 8 );
    if( pKey ){
      rc = sqlite3BtreePayload(pCur, 0, (int)pCur->nKey, pKey);
      if( rc==SQLITE_OK ){
        memset(((u8*)pKey)+pCur->nKey, 0, 9+8);
        pCur->pKey = pKey;
      }else{
        sqlite3_free(pKey);
      }
    }else{
      rc = SQLITE_NOMEM_BKPT;
    }
  }
  assert( !pCur->curIntKey || !pCur->pKey );
  return rc;
}